

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

void sexp_usage(int err)

{
  undefined8 *puVar1;
  
  if (err == 0) {
    puVar1 = (undefined8 *)&stdout;
  }
  else {
    puVar1 = (undefined8 *)&stderr;
  }
  fwrite("usage: chibi-scheme [<options> ...] [<file> <args> ...]\n  -f           - case-fold symbols\n  -q           - \"quick\" load, use the core -xchibi language\n  -Q           - extra \"quick\" load, -xchibi.primitive\n  -V           - print version information\n  -D <feature> - add <feature> to the list of features\n  -h <size>    - specify the initial heap size\n  -A <dir>     - append a module search directory\n  -I <dir>     - prepend a module search directory\n  -m <module>  - import a module\n  -x <module>  - import only a module\n  -e <expr>    - evaluate an expression\n  -p <expr>    - evaluate and print an expression\n  -r[<main>]   - run a SRFI-22 main\n  -R[<module>] - run main from a module\n  -t <module.proc> - trace a procedure\n  -T           - disable TCO (dangerous)\n  -d <file>    - dump an image file and exit\n  -i <file>    - load an image file\n  -b           - Make stdio nonblocking\n"
         ,0x37b,1,(FILE *)*puVar1);
  if (err == 0) {
    exit(0);
  }
  exit(0x46);
}

Assistant:

void sexp_usage(int err) {
  FILE *out = err ? stderr : stdout;
  fprintf(out, "usage: chibi-scheme [<options> ...] [<file> <args> ...]\n"
#if SEXP_USE_FOLD_CASE_SYMS
         "  -f           - case-fold symbols\n"
#endif
         "  -q           - \"quick\" load, use the core -xchibi language\n"
         "  -Q           - extra \"quick\" load, -xchibi.primitive\n"
         "  -V           - print version information\n"
         "  -D <feature> - add <feature> to the list of features\n"
#if ! SEXP_USE_BOEHM
         "  -h <size>    - specify the initial heap size\n"
#endif
#if SEXP_USE_MODULES
         "  -A <dir>     - append a module search directory\n"
         "  -I <dir>     - prepend a module search directory\n"
         "  -m <module>  - import a module\n"
         "  -x <module>  - import only a module\n"
#endif
         "  -e <expr>    - evaluate an expression\n"
         "  -p <expr>    - evaluate and print an expression\n"
         "  -r[<main>]   - run a SRFI-22 main\n"
         "  -R[<module>] - run main from a module\n"
         "  -t <module.proc> - trace a procedure\n"
         "  -T           - disable TCO (dangerous)\n"
#if SEXP_USE_IMAGE_LOADING
         "  -d <file>    - dump an image file and exit\n"
         "  -i <file>    - load an image file\n"
#endif
#if SEXP_USE_GREEN_THREADS
         "  -b           - Make stdio nonblocking\n"
#endif
         );
  if (err == 0) exit_success();
  else exit_failure();
}